

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::ShowPartList(BoardView *this,bool *p_open)

{
  int iVar1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if (ShowPartList(bool*)::partList == '\0') {
    iVar1 = __cxa_guard_acquire(&ShowPartList(bool*)::partList);
    if (iVar1 != 0) {
      local_28 = (code *)0x0;
      pcStack_20 = (code *)0x0;
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      local_38._M_unused._M_object = operator_new(0x18);
      *(code **)local_38._M_unused._0_8_ = FindComponent;
      *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
      *(BoardView **)((long)local_38._M_unused._0_8_ + 0x10) = this;
      pcStack_20 = std::
                   _Function_handler<void_(const_char_*),_std::_Bind<void_(BoardView::*(BoardView_*,_std::_Placeholder<1>))(const_char_*)>_>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_char_*),_std::_Bind<void_(BoardView::*(BoardView_*,_std::_Placeholder<1>))(const_char_*)>_>
                 ::_M_manager;
      PartList::PartList(&ShowPartList::partList,&this->keybindings,(TcharStringCallback *)&local_38
                        );
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
      __cxa_atexit(PartList::~PartList,&ShowPartList::partList,&__dso_handle);
      __cxa_guard_release(&ShowPartList(bool*)::partList);
    }
  }
  PartList::Draw(&ShowPartList::partList,"Part List",p_open,this->m_board);
  return;
}

Assistant:

void BoardView::ShowPartList(bool *p_open) {
	static PartList partList(keybindings, std::bind(&BoardView::FindComponent, this, std::placeholders::_1));
	partList.Draw("Part List", p_open, m_board);
}